

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LU.hpp
# Opt level: O2

bool OpenMD::invertMatrix<OpenMD::SquareMatrix<double,6>>
               (SquareMatrix<double,_6> *A,SquareMatrix<double,_6> *AI,uint size,int *tmp1Size,
               ElemPoinerType tmp2Size)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  double (*padVar4) [6];
  long lVar5;
  
  if (size == 6) {
    iVar2 = LUFactorLinearSystem<OpenMD::SquareMatrix<double,6>>(A,tmp1Size,6,tmp2Size);
    if (iVar2 == 0) {
      bVar1 = false;
    }
    else {
      for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
        for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
          tmp2Size[lVar3] = 0.0;
        }
        tmp2Size[lVar5] = 1.0;
        LUSolveLinearSystem<OpenMD::SquareMatrix<double,6>>(A,tmp1Size,tmp2Size,6);
        padVar4 = (double (*) [6])AI;
        for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
          ((RectMatrix<double,_6U,_6U> *)*padVar4)->data_[0][0] = tmp2Size[lVar3];
          padVar4 = padVar4 + 1;
        }
        AI = (SquareMatrix<double,_6> *)(*(double (*) [6])AI + 1);
      }
      bVar1 = true;
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool invertMatrix(MatrixType& A, MatrixType& AI, unsigned int size,
                    int* tmp1Size,
                    typename MatrixType::ElemPoinerType tmp2Size) {
    if (A.getNRow() != A.getNCol() || A.getNRow() != AI.getNRow() ||
        A.getNCol() != AI.getNCol() || A.getNRow() != size) {
      return false;
    }

    unsigned int i, j;

    //
    // Factor matrix; then begin solving for inverse one column at a time.
    // Note: tmp1Size returned value is used later, tmp2Size is just working
    // memory whose values are not used in LUSolveLinearSystem
    //
    if (LUFactorLinearSystem(A, tmp1Size, size, tmp2Size) == 0) {
      return false;
    }

    for (j = 0; j < size; ++j) {
      for (i = 0; i < size; ++i) {
        tmp2Size[i] = 0.0;
      }
      tmp2Size[j] = 1.0;

      LUSolveLinearSystem(A, tmp1Size, tmp2Size, size);

      for (i = 0; i < size; i++) {
        AI(i, j) = tmp2Size[i];
      }
    }

    return true;
  }